

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

void __thiscall gamespace::BoardTile::__introspect(BoardTile *this,size_t off)

{
  ostream *poVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)off);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_38);
  poVar1 = std::operator<<(poVar1,"BoardTile[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->_p).x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->_p).y);
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_38);
  if (this->_unit != (Unit *)0x0) {
    Unit::__introspect(this->_unit,off + 2);
  }
  return;
}

Assistant:

void BoardTile::__introspect(size_t off) {
    std::cout << std::string(off, ' ') << "BoardTile[" << _p.x << "," << _p.y << "]" << std::endl;
    if(_unit) _unit->__introspect(off + 2);
}